

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactSonameTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactSonameTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  GeneratorExpressionContent *pGVar1;
  bool bVar2;
  TargetType TVar3;
  string local_110;
  char local_e9;
  string local_e8;
  undefined1 local_c2;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  cmGeneratorExpressionContext *local_28;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  cmGeneratorTarget *target_local;
  string *result;
  
  local_28 = context;
  content_local = (GeneratorExpressionContent *)target;
  context_local = (cmGeneratorExpressionContext *)this;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  bVar2 = cmGeneratorTarget::IsDLLPlatform((cmGeneratorTarget *)this);
  pGVar1 = content_local;
  if (bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_48,(GeneratorExpressionContent *)local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"TARGET_SONAME_FILE is not allowed for DLL target platforms.",
               &local_69);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)context_local);
    pGVar1 = content_local;
    if (TVar3 == SHARED_LIBRARY) {
      local_c2 = 0;
      cmGeneratorTarget::GetDirectory
                (&local_e8,(cmGeneratorTarget *)context_local,
                 (string *)
                 &content_local[3].ParamChildren.
                  super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,RuntimeBinaryArtifact);
      local_e9 = '/';
      cmGeneratorTarget::GetSOName
                (&local_110,(cmGeneratorTarget *)context_local,
                 (string *)
                 &content_local[3].ParamChildren.
                  super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,RuntimeBinaryArtifact);
      cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
                (__return_storage_ptr__,&local_e8,&local_e9,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_a0,(GeneratorExpressionContent *)local_28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"TARGET_SONAME_FILE is allowed only for SHARED libraries.",
                 &local_c1);
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_a0,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    // The target soname file (.so.1).
    if (target->IsDLLPlatform()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is not allowed "
                    "for DLL target platforms.");
      return std::string();
    }
    if (target->GetType() != cmStateEnums::SHARED_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is allowed only for "
                    "SHARED libraries.");
      return std::string();
    }
    std::string result = cmStrCat(target->GetDirectory(context->Config), '/',
                                  target->GetSOName(context->Config));
    return result;
  }